

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata_impl.h
# Opt level: O0

void __thiscall
QtPrivate::
QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QGraphicsItem_*,_std::less<int>,_std::allocator<std::pair<const_int,_QGraphicsItem_*>_>_>_>_>
::reset(QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QGraphicsItem_*,_std::less<int>,_std::allocator<std::pair<const_int,_QGraphicsItem_*>_>_>_>_>
        *this,QMapData<std::map<int,_QGraphicsItem_*,_std::less<int>,_std::allocator<std::pair<const_int,_QGraphicsItem_*>_>_>_>
              *t)

{
  bool bVar1;
  QMapData<std::map<int,_QGraphicsItem_*,_std::less<int>,_std::allocator<std::pair<const_int,_QGraphicsItem_*>_>_>_>
  *pQVar2;
  QMapData<std::map<int,_QGraphicsItem_*,_std::less<int>,_std::allocator<std::pair<const_int,_QGraphicsItem_*>_>_>_>
  *in_RSI;
  totally_ordered_wrapper<QMapData<std::map<int,_QGraphicsItem_*,_std::less<int>,_std::allocator<std::pair<const_int,_QGraphicsItem_*>_>_>_>_*>
  *in_RDI;
  
  bVar1 = Qt::totally_ordered_wrapper::operator_cast_to_bool
                    ((totally_ordered_wrapper<QMapData<std::map<int,_QGraphicsItem_*,_std::less<int>,_std::allocator<std::pair<const_int,_QGraphicsItem_*>_>_>_>_*>
                      *)0x9eb5b1);
  if (bVar1) {
    Qt::
    totally_ordered_wrapper<QMapData<std::map<int,_QGraphicsItem_*,_std::less<int>,_std::allocator<std::pair<const_int,_QGraphicsItem_*>_>_>_>_*>
    ::operator->((totally_ordered_wrapper<QMapData<std::map<int,_QGraphicsItem_*,_std::less<int>,_std::allocator<std::pair<const_int,_QGraphicsItem_*>_>_>_>_*>
                  *)0x9eb5c1);
    bVar1 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x9eb5c9);
    if ((!bVar1) &&
       (pQVar2 = Qt::
                 totally_ordered_wrapper<QMapData<std::map<int,_QGraphicsItem_*,_std::less<int>,_std::allocator<std::pair<const_int,_QGraphicsItem_*>_>_>_>_*>
                 ::get(in_RDI),
       pQVar2 != (QMapData<std::map<int,_QGraphicsItem_*,_std::less<int>,_std::allocator<std::pair<const_int,_QGraphicsItem_*>_>_>_>
                  *)0x0)) {
      QMapData<std::map<int,_QGraphicsItem_*,_std::less<int>,_std::allocator<std::pair<const_int,_QGraphicsItem_*>_>_>_>
      ::~QMapData((QMapData<std::map<int,_QGraphicsItem_*,_std::less<int>,_std::allocator<std::pair<const_int,_QGraphicsItem_*>_>_>_>
                   *)0x9eb5ec);
      operator_delete(pQVar2,0x38);
    }
  }
  Qt::
  totally_ordered_wrapper<QMapData<std::map<int,_QGraphicsItem_*,_std::less<int>,_std::allocator<std::pair<const_int,_QGraphicsItem_*>_>_>_>_*>
  ::reset(in_RDI,in_RSI);
  bVar1 = Qt::totally_ordered_wrapper::operator_cast_to_bool
                    ((totally_ordered_wrapper<QMapData<std::map<int,_QGraphicsItem_*,_std::less<int>,_std::allocator<std::pair<const_int,_QGraphicsItem_*>_>_>_>_*>
                      *)0x9eb616);
  if (bVar1) {
    Qt::
    totally_ordered_wrapper<QMapData<std::map<int,_QGraphicsItem_*,_std::less<int>,_std::allocator<std::pair<const_int,_QGraphicsItem_*>_>_>_>_*>
    ::operator->((totally_ordered_wrapper<QMapData<std::map<int,_QGraphicsItem_*,_std::less<int>,_std::allocator<std::pair<const_int,_QGraphicsItem_*>_>_>_>_*>
                  *)0x9eb626);
    QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x9eb62e);
  }
  return;
}

Assistant:

void reset(T *t = nullptr) noexcept
    {
        if (d && !d->ref.deref())
            delete d.get();
        d.reset(t);
        if (d)
            d->ref.ref();
    }